

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

uint64_t capnp::compiler::generateRandomId(void)

{
  int iVar1;
  OwnFd fd;
  ssize_t n;
  Fault f_2;
  Fault f_1;
  uint64_t result;
  OwnFd local_5c;
  Fault local_58;
  Fault local_50;
  Fault local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 local_30;
  undefined1 local_28;
  ulong local_20;
  
  do {
    local_5c.fd = open("/dev/urandom",0);
    if (-1 < local_5c.fd) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_58.exception = (Exception *)0x0;
    local_48.exception = (Exception *)0x0;
    uStack_40 = 0;
    kj::_::Debug::Fault::init
              (&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
              );
    kj::_::Debug::Fault::fatal(&local_58);
  }
  do {
    local_58.exception = (Exception *)read(local_5c.fd,&local_20,8);
    if (-1 < (long)local_58.exception) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault<int,char_const(&)[13]>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x40,iVar1,"n = read(fd, &result, sizeof(result))","\"/dev/urandom\"",
               (char (*) [13])"/dev/urandom");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  local_48.exception = (Exception *)&local_58;
  local_28 = local_58.exception == (Exception *)&DAT_00000008;
  uStack_40 = 8;
  local_38 = " == ";
  local_30 = 5;
  if (!(bool)local_28) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long>&,char_const(&)[35],long&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x41,FAILED,"n == sizeof(result)",
               "_kjCondition,\"Incomplete read from /dev/urandom.\", n",
               (DebugComparison<long_&,_unsigned_long> *)&local_48,
               (char (*) [35])"Incomplete read from /dev/urandom.",(long *)local_48.exception);
    kj::_::Debug::Fault::fatal(&local_50);
  }
  kj::OwnFd::~OwnFd(&local_5c);
  return local_20 | 0x8000000000000000;
}

Assistant:

uint64_t generateRandomId() {
  uint64_t result;

#if _WIN32
  HCRYPTPROV handle;
  KJ_ASSERT(CryptAcquireContextW(&handle, nullptr, nullptr,
                                 PROV_RSA_FULL, CRYPT_VERIFYCONTEXT | CRYPT_SILENT));
  KJ_DEFER(KJ_ASSERT(CryptReleaseContext(handle, 0)) {break;});

  KJ_ASSERT(CryptGenRandom(handle, sizeof(result), reinterpret_cast<BYTE*>(&result)));

#else
  auto fd = KJ_SYSCALL_FD(open("/dev/urandom", O_RDONLY));

  ssize_t n;
  KJ_SYSCALL(n = read(fd, &result, sizeof(result)), "/dev/urandom");
  KJ_ASSERT(n == sizeof(result), "Incomplete read from /dev/urandom.", n);
#endif

  return result | (1ull << 63);
}